

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

void json_set_float_serialization_format(char *format)

{
  long in_RDI;
  
  if (parson_float_format != (char *)0x0) {
    (*parson_free)(parson_float_format);
    parson_float_format = (char *)0x0;
  }
  if (in_RDI == 0) {
    parson_float_format = (char *)0x0;
  }
  else {
    parson_float_format = parson_strdup(format);
  }
  return;
}

Assistant:

void json_set_float_serialization_format(const char *format) {
    if (parson_float_format) {
        parson_free(parson_float_format);
        parson_float_format = NULL;
    }
    if (!format) {
        parson_float_format = NULL;
        return;
    }
    parson_float_format = parson_strdup(format);
}